

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_cure_all(command_conflict *cmd)

{
  source sVar1;
  source origin;
  source origin_00;
  wchar_t local_14;
  wchar_t i;
  command_conflict *cmd_local;
  
  for (local_14 = 0; local_14 < (int)(uint)(player->body).count; local_14 = local_14 + 1) {
    if (((player->body).slots[local_14].obj != (object *)0x0) &&
       (((player->body).slots[local_14].obj)->curses != (curse_data *)0x0)) {
      mem_free(((player->body).slots[local_14].obj)->curses);
      ((player->body).slots[local_14].obj)->curses = (curse_data *)0x0;
    }
  }
  for (local_14 = L'\0'; local_14 < L'\x05'; local_14 = local_14 + L'\x01') {
    sVar1 = source_player();
    origin.which = sVar1.which;
    origin._4_4_ = 0;
    origin.what = sVar1.what;
    effect_simple(L'\x10',origin,"0",local_14,L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  }
  sVar1 = source_none();
  origin_00.which = sVar1.which;
  origin_00._4_4_ = 0;
  origin_00.what = sVar1.what;
  effect_simple(L'\x14',origin_00,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  player->chp = player->mhp;
  player->chp_frac = 0;
  player->csp = player->msp;
  player->csp_frac = 0;
  player_clear_timed(player,L'\x02',true,false);
  player_clear_timed(player,L'\x04',true,false);
  player_clear_timed(player,L'\a',true,false);
  player_clear_timed(player,L'\x05',true,false);
  player_clear_timed(player,L'\x03',true,false);
  player_clear_timed(player,L'\x06',true,false);
  player_clear_timed(player,L'\t',true,false);
  player_clear_timed(player,L'\b',true,false);
  player_clear_timed(player,L'\x01',true,false);
  player_clear_timed(player,L'\x19',true,false);
  player_set_timed(player,L'\n',PY_FOOD_FULL + L'\xffffffff',false,false);
  player->upkeep->update = player->upkeep->update | 0x62;
  player->upkeep->redraw = player->upkeep->redraw | 0x5bfff;
  msg("You feel *much* better!");
  return;
}

Assistant:

void do_cmd_wiz_cure_all(struct command *cmd)
{
	int i;

	/* Remove curses */
	for (i = 0; i < player->body.count; i++) {
		if (player->body.slots[i].obj &&
				player->body.slots[i].obj->curses) {
			mem_free(player->body.slots[i].obj->curses);
			player->body.slots[i].obj->curses = NULL;
		}
	}

	/* Restore stats */
	for (i = 0; i < STAT_MAX; i++) {
		effect_simple(EF_RESTORE_STAT, source_player(), "0", i,
			0, 0, 0, 0, NULL);
	}

	/* Restore the level */
	effect_simple(EF_RESTORE_EXP, source_none(), "0", 0, 0, 0, 0, 0, NULL);

	/* Heal the player */
	player->chp = player->mhp;
	player->chp_frac = 0;

	/* Restore mana */
	player->csp = player->msp;
	player->csp_frac = 0;

	/* Cure stuff */
	(void) player_clear_timed(player, TMD_BLIND, true, false);
	(void) player_clear_timed(player, TMD_CONFUSED, true, false);
	(void) player_clear_timed(player, TMD_POISONED, true, false);
	(void) player_clear_timed(player, TMD_AFRAID, true, false);
	(void) player_clear_timed(player, TMD_PARALYZED, true, false);
	(void) player_clear_timed(player, TMD_IMAGE, true, false);
	(void) player_clear_timed(player, TMD_STUN, true, false);
	(void) player_clear_timed(player, TMD_CUT, true, false);
	(void) player_clear_timed(player, TMD_SLOW, true, false);
	(void) player_clear_timed(player, TMD_AMNESIA, true, false);

	/* No longer hungry */
	player_set_timed(player, TMD_FOOD, PY_FOOD_FULL - 1, false, false);

	/* Flag what needs to be updated or redrawn */
	player->upkeep->update |= PU_TORCH | PU_UPDATE_VIEW | PU_MONSTERS;
	player->upkeep->redraw |= PR_BASIC | PR_EXTRA | PR_MAP | PR_EQUIP;

	/* Give the player some feedback */
	msg("You feel *much* better!");
}